

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printLineOrder(LineOrder lo)

{
  int in_EDI;
  
  if (in_EDI == 0) {
    std::operator<<((ostream *)&std::cout,"increasing y");
  }
  else if (in_EDI == 1) {
    std::operator<<((ostream *)&std::cout,"decreasing y");
  }
  else if (in_EDI == 2) {
    std::operator<<((ostream *)&std::cout,"random y");
  }
  else {
    std::ostream::operator<<(&std::cout,in_EDI);
  }
  return;
}

Assistant:

void
printLineOrder (LineOrder lo)
{
    switch (lo)
    {
        case INCREASING_Y: cout << "increasing y"; break;

        case DECREASING_Y: cout << "decreasing y"; break;

        case RANDOM_Y: cout << "random y"; break;

        default: cout << int (lo); break;
    }
}